

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackPropertiesGenerator.cxx
# Opt level: O1

void __thiscall
cmCPackPropertiesGenerator::GenerateScriptForConfig
          (cmCPackPropertiesGenerator *this,ostream *os,string *config,Indent indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr p_Var2;
  pointer pcVar3;
  cmCompiledGeneratorExpression *this_00;
  ostream *poVar4;
  string *psVar5;
  undefined8 uVar6;
  int iVar7;
  _Base_ptr p_Var8;
  string_view str;
  string_view str_00;
  string_view str_01;
  string value;
  string local_a0;
  int local_7c;
  string local_78;
  _Base_ptr local_58;
  cmCPackPropertiesGenerator *local_50;
  _Base_ptr local_48;
  string *local_40;
  string *local_38;
  
  local_7c = indent.Level;
  this_00 = cmInstalledFile::GetNameExpression(this->InstalledFile);
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  uVar6 = 0;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_50 = this;
  local_38 = config;
  local_40 = cmCompiledGeneratorExpression::Evaluate
                       (this_00,this->LG,config,(cmGeneratorTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  local_58 = (local_50->InstalledFile->Properties)._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_left;
  local_48 = &(local_50->InstalledFile->Properties)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_58 != local_48) {
    paVar1 = &local_78.field_2;
    do {
      iVar7 = local_7c;
      if (0 < local_7c) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(INSTALL ",0x15);
      str._M_str = (char *)0x0;
      str._M_len = (size_t)(local_40->_M_dataplus)._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                (&local_a0,(cmOutputConverter *)local_40->_M_string_length,str,(WrapQuotes)uVar6);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_a0._M_dataplus._M_p,local_a0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," PROPERTY ",10);
      p_Var8 = local_58;
      str_00._M_str = (char *)0x0;
      str_00._M_len = *(ulong *)(local_58 + 1);
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                (&local_78,(cmOutputConverter *)local_58[1]._M_parent,str_00,(WrapQuotes)uVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,local_78._M_dataplus._M_p,local_78._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                 local_78.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,
                        CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                 local_a0.field_2._M_local_buf[0]) + 1);
      }
      p_Var2 = p_Var8[2]._M_parent;
      for (p_Var8 = *(_Base_ptr *)(p_Var8 + 2); p_Var8 != p_Var2;
          p_Var8 = (_Base_ptr)&p_Var8->_M_parent) {
        local_78._M_string_length = 0;
        local_78.field_2._M_local_buf[0] = '\0';
        uVar6 = 0;
        local_78._M_dataplus._M_p = (pointer)paVar1;
        psVar5 = cmCompiledGeneratorExpression::Evaluate
                           (*(cmCompiledGeneratorExpression **)p_Var8,local_50->LG,local_38,
                            (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                            (cmGeneratorTarget *)0x0,&local_78);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        pcVar3 = (psVar5->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,pcVar3,pcVar3 + psVar5->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p,
                          CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                   local_78.field_2._M_local_buf[0]) + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        str_01._M_str = (char *)0x0;
        str_01._M_len = (size_t)local_a0._M_dataplus._M_p;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  (&local_78,(cmOutputConverter *)local_a0._M_string_length,str_01,(WrapQuotes)uVar6
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,local_78._M_dataplus._M_p,local_78._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p,
                          CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                   local_78.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,
                          CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                   local_a0.field_2._M_local_buf[0]) + 1);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,")\n",2);
      local_58 = (_Base_ptr)std::_Rb_tree_increment(local_58);
    } while (local_58 != local_48);
  }
  return;
}

Assistant:

void cmCPackPropertiesGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  std::string const& expandedFileName =
    this->InstalledFile.GetNameExpression().Evaluate(this->LG, config);

  cmInstalledFile::PropertyMapType const& properties =
    this->InstalledFile.GetProperties();

  for (cmInstalledFile::PropertyMapType::value_type const& i : properties) {
    std::string const& name = i.first;
    cmInstalledFile::Property const& property = i.second;

    os << indent << "set_property(INSTALL "
       << cmOutputConverter::EscapeForCMake(expandedFileName) << " PROPERTY "
       << cmOutputConverter::EscapeForCMake(name);

    for (cmInstalledFile::ExpressionVectorType::value_type const& j :
         property.ValueExpressions) {
      std::string value = j->Evaluate(this->LG, config);
      os << " " << cmOutputConverter::EscapeForCMake(value);
    }

    os << ")\n";
  }
}